

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O0

bool CEditor::PopupColorPicker(void *pContext,CUIRect View)

{
  vector2_base<float> vVar1;
  vec3 rgb;
  vec3 hsv_00;
  vec3 hsv_01;
  vec3 hsv_02;
  anon_union_4_3_4e90b46e_for_vector3_base<float>_1 aVar2;
  anon_union_4_3_4e90b0cd_for_vector3_base<float>_3 aVar3;
  bool bVar4;
  IGraphics *pIVar5;
  CEditor *in_RDI;
  long in_FS_OFFSET;
  float x;
  float fVar6;
  float fVar7;
  float w;
  float fVar8;
  float fVar9;
  float y;
  float fVar10;
  float h;
  vec3 vVar11;
  int j;
  float Offset;
  vec2 Marker;
  CEditor *pEditor;
  CQuadItem QuadItemMarker;
  CQuadItem QuadItem_1;
  vec4 ColorBottom;
  vec4 ColorTop;
  float Y;
  float X;
  CQuadItem QuadItem;
  vec3 c;
  vec3 hsv;
  CUIRect Palette;
  CUIRect HuePicker;
  CUIRect SVPicker;
  CQuadItem aMarker [2];
  CColorVertex ColorArray [4];
  CUIRect *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  float in_stack_fffffffffffffbb4;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  int iVar12;
  int i;
  int i_00;
  float ny;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 aVar13;
  undefined4 uStack_3fc;
  undefined4 in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  uint uVar14;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 in_stack_fffffffffffffc10;
  undefined4 uVar15;
  undefined4 uStack_3ec;
  uint i_01;
  float a;
  vec4 *Color;
  CUIRect *this;
  CQuadItem *local_3c8;
  CColorVertex *local_3b0;
  int local_3a8;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_3a0;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_39c;
  vector3_base<float> local_364;
  undefined8 local_358;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 local_350;
  CQuadItem local_34c;
  CQuadItem local_33c;
  CColorVertex local_32c;
  CColorVertex local_318;
  CColorVertex local_304;
  CColorVertex local_2f0;
  vector4_base<float> local_2dc;
  vector4_base<float> local_2cc;
  anon_union_4_2_94730227_for_vector4_base<float>_1 local_2bc;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 aStack_2b8;
  anon_union_4_2_94730039_for_vector4_base<float>_5 local_2b4;
  anon_union_4_2_94730017_for_vector4_base<float>_7 aStack_2b0;
  anon_union_4_2_94730227_for_vector4_base<float>_1 local_2ac;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 aStack_2a8;
  anon_union_4_2_94730039_for_vector4_base<float>_5 local_2a4;
  anon_union_4_2_94730017_for_vector4_base<float>_7 aStack_2a0;
  float local_29c;
  float local_298;
  CQuadItem local_294;
  CQuadItem local_284;
  undefined1 local_274 [16];
  CColorVertex local_264;
  CColorVertex local_250;
  CColorVertex local_23c;
  CColorVertex local_228;
  CQuadItem local_214;
  CColorVertex local_204;
  undefined8 local_1f0;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 local_1e8;
  vector3_base<float> local_1e0;
  vector3_base<float> local_1cc;
  undefined8 local_1c0;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 local_1b8;
  CColorVertex local_1b4;
  undefined8 local_1a0;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 local_198;
  vector3_base<float> local_190;
  vector3_base<float> local_17c;
  undefined8 local_170;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 local_168;
  CColorVertex local_164;
  undefined8 local_150;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 local_148;
  vector3_base<float> local_140;
  vector3_base<float> local_12c;
  undefined8 local_120;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 local_118;
  CColorVertex local_114;
  undefined8 local_100;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 local_f8;
  vector3_base<float> local_f0;
  vector3_base<float> local_dc;
  undefined8 local_d0;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 local_c8;
  undefined8 local_c4;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 local_bc;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  CQuadItem local_78;
  CQuadItem local_68;
  CColorVertex local_58;
  CColorVertex local_44;
  CColorVertex local_30;
  CColorVertex local_1c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CUIRect::HSplitBottom
            ((CUIRect *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
             in_stack_fffffffffffffbb4,in_stack_fffffffffffffba8,(CUIRect *)0x2166bb);
  CUIRect::VSplitRight
            ((CUIRect *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
             in_stack_fffffffffffffbb4,in_stack_fffffffffffffba8,(CUIRect *)0x2166db);
  CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                      in_stack_fffffffffffffbb4,in_stack_fffffffffffffba8,(CUIRect *)0x2166f7);
  CUIRect::HSplitTop((CUIRect *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                     in_stack_fffffffffffffbb4,in_stack_fffffffffffffba8,(CUIRect *)0x216713);
  Graphics(in_RDI);
  IGraphics::TextureClear
            ((IGraphics *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  pIVar5 = Graphics(in_RDI);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x17])();
  local_c4._0_4_ = *(float *)&(in_RDI->m_SelectedPickerColor).field_0;
  local_c4._4_4_ = *(float *)&(in_RDI->m_SelectedPickerColor).field_1;
  local_bc = (in_RDI->m_SelectedPickerColor).field_2;
  local_3b0 = &local_58;
  do {
    IGraphics::CColorVertex::CColorVertex(local_3b0);
    local_3b0 = local_3b0 + 1;
  } while (local_3b0 != (CColorVertex *)&stack0xfffffffffffffff8);
  ny = 0.0;
  a = 1.0;
  vector3_base<float>::vector3_base(&local_dc,(float)local_c4,0.0,1.0);
  local_f0.field_2 = local_dc.field_2;
  local_f0.field_0 = local_dc.field_0;
  local_f0.field_1 = local_dc.field_1;
  vVar11.field_1 = (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)in_stack_fffffffffffffc0c;
  vVar11.field_0 = (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)in_stack_fffffffffffffc08;
  vVar11.field_2 = in_stack_fffffffffffffc10;
  vVar11 = HsvToRgb(vVar11);
  local_f8 = vVar11.field_2;
  local_100 = vVar11._0_8_;
  local_d0._0_4_ = vVar11.field_0;
  aVar2 = local_d0._0_4_;
  local_d0._4_4_ = vVar11.field_1;
  aVar3 = local_d0._4_4_;
  iVar12 = 0;
  local_d0 = local_100;
  local_c8 = local_f8;
  IGraphics::CColorVertex::CColorVertex(&local_114,0,aVar2.x,aVar3.y,local_f8.z,a);
  local_58.m_A = local_114.m_A;
  local_58.m_Index = local_114.m_Index;
  local_58.m_R = local_114.m_R;
  local_58.m_G = local_114.m_G;
  local_58.m_B = local_114.m_B;
  vector3_base<float>::vector3_base(&local_12c,(float)local_c4,a,a);
  local_140.field_2 = local_12c.field_2;
  local_140.field_0 = local_12c.field_0;
  local_140.field_1 = local_12c.field_1;
  hsv_00.field_1 = (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)in_stack_fffffffffffffc0c;
  hsv_00.field_0 = (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)in_stack_fffffffffffffc08;
  hsv_00.field_2 = in_stack_fffffffffffffc10;
  vVar11 = HsvToRgb(hsv_00);
  local_148 = vVar11.field_2;
  local_150 = vVar11._0_8_;
  local_d0._0_4_ = vVar11.field_0;
  aVar2 = local_d0._0_4_;
  local_d0._4_4_ = vVar11.field_1;
  aVar3 = local_d0._4_4_;
  i_01 = 1;
  local_120 = local_150;
  local_118 = local_148;
  local_d0 = local_150;
  local_c8 = local_148;
  IGraphics::CColorVertex::CColorVertex(&local_164,1,aVar2.x,aVar3.y,local_148.z,a);
  local_44.m_A = local_164.m_A;
  local_44.m_Index = local_164.m_Index;
  local_44.m_R = local_164.m_R;
  local_44.m_G = local_164.m_G;
  local_44.m_B = local_164.m_B;
  vector3_base<float>::vector3_base(&local_17c,(float)local_c4,a,a);
  local_190.field_2 = local_17c.field_2;
  local_190.field_0 = local_17c.field_0;
  local_190.field_1 = local_17c.field_1;
  hsv_01.field_1 = (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)in_stack_fffffffffffffc0c;
  hsv_01.field_0 = (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)in_stack_fffffffffffffc08;
  hsv_01.field_2 = in_stack_fffffffffffffc10;
  vVar11 = HsvToRgb(hsv_01);
  local_198 = vVar11.field_2;
  local_1a0 = vVar11._0_8_;
  local_d0._0_4_ = vVar11.field_0;
  aVar2 = local_d0._0_4_;
  local_d0._4_4_ = vVar11.field_1;
  aVar3 = local_d0._4_4_;
  i = 2;
  local_170 = local_1a0;
  local_168 = local_198;
  local_d0 = local_1a0;
  local_c8 = local_198;
  IGraphics::CColorVertex::CColorVertex(&local_1b4,2,aVar2.x,aVar3.y,local_198.z,a);
  local_30.m_A = local_1b4.m_A;
  local_30.m_Index = local_1b4.m_Index;
  local_30.m_R = local_1b4.m_R;
  local_30.m_G = local_1b4.m_G;
  local_30.m_B = local_1b4.m_B;
  vector3_base<float>::vector3_base(&local_1cc,(float)local_c4,ny,a);
  local_1e0.field_2 = local_1cc.field_2;
  local_1e0.field_0 = local_1cc.field_0;
  local_1e0.field_1 = local_1cc.field_1;
  hsv_02.field_1 = (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)in_stack_fffffffffffffc0c;
  hsv_02.field_0 = (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)in_stack_fffffffffffffc08;
  hsv_02.field_2 = in_stack_fffffffffffffc10;
  vVar11 = HsvToRgb(hsv_02);
  local_1e8 = vVar11.field_2;
  local_1f0 = vVar11._0_8_;
  local_d0._0_4_ = vVar11.field_0;
  aVar2 = local_d0._0_4_;
  local_d0._4_4_ = vVar11.field_1;
  aVar3 = local_d0._4_4_;
  i_00 = 3;
  local_1c0 = local_1f0;
  local_1b8 = local_1e8;
  local_d0 = local_1f0;
  local_c8 = local_1e8;
  IGraphics::CColorVertex::CColorVertex(&local_204,3,aVar2.x,aVar3.y,local_1e8.z,a);
  local_1c.m_A = local_204.m_A;
  local_1c.m_Index = local_204.m_Index;
  local_1c.m_R = local_204.m_R;
  local_1c.m_G = local_204.m_G;
  local_1c.m_B = local_204.m_B;
  pIVar5 = Graphics(in_RDI);
  aVar13 = SUB84(&local_58,0);
  uStack_3fc = (undefined4)((ulong)&local_58 >> 0x20);
  uVar14 = 4;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x20])();
  uVar15 = SUB84(&local_214,0);
  uStack_3ec = (undefined4)((ulong)&local_214 >> 0x20);
  IGraphics::CQuadItem::CQuadItem(&local_214,local_98,local_94,local_90,local_8c);
  pIVar5 = Graphics(in_RDI);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x1d])
            (pIVar5,CONCAT44(uStack_3ec,uVar15),(ulong)i_01);
  IGraphics::CColorVertex::CColorVertex(&local_228,iVar12,ny,ny,ny,ny);
  local_58.m_A = local_228.m_A;
  local_58.m_Index = local_228.m_Index;
  local_58.m_R = local_228.m_R;
  local_58.m_G = local_228.m_G;
  local_58.m_B = local_228.m_B;
  IGraphics::CColorVertex::CColorVertex(&local_23c,i_01,ny,ny,ny,ny);
  local_44.m_A = local_23c.m_A;
  local_44.m_Index = local_23c.m_Index;
  local_44.m_R = local_23c.m_R;
  local_44.m_G = local_23c.m_G;
  local_44.m_B = local_23c.m_B;
  IGraphics::CColorVertex::CColorVertex(&local_250,i,ny,ny,ny,a);
  local_30.m_A = local_250.m_A;
  local_30.m_Index = local_250.m_Index;
  local_30.m_R = local_250.m_R;
  local_30.m_G = local_250.m_G;
  local_30.m_B = local_250.m_B;
  IGraphics::CColorVertex::CColorVertex(&local_264,i_00,ny,ny,ny,a);
  local_1c.m_A = local_264.m_A;
  local_1c.m_Index = local_264.m_Index;
  local_1c.m_R = local_264.m_R;
  local_1c.m_G = local_264.m_G;
  local_1c.m_B = local_264.m_B;
  pIVar5 = Graphics(in_RDI);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x20])
            (pIVar5,CONCAT44(uStack_3fc,aVar13),(ulong)uVar14);
  pIVar5 = Graphics(in_RDI);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x1d])
            (pIVar5,CONCAT44(uStack_3ec,uVar15),(ulong)i_01);
  pIVar5 = Graphics(in_RDI);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x18])();
  Color = (vec4 *)(local_274 + 8);
  vector2_base<float>::vector2_base((vector2_base<float> *)Color,local_c4._4_4_,a - local_bc.z);
  this = (CUIRect *)local_274;
  vector2_base<float>::vector2_base((vector2_base<float> *)this,local_90,local_8c);
  vVar1 = vector2_base<float>::operator*
                    ((vector2_base<float> *)
                     CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                     (vector2_base<float> *)
                     CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  pIVar5 = Graphics(in_RDI);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x17])();
  pIVar5 = Graphics(in_RDI);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x21])(0x3f000000,0x3f000000,0x3f000000,0x3f800000);
  local_3c8 = &local_78;
  do {
    IGraphics::CQuadItem::CQuadItem(local_3c8);
    local_3c8 = local_3c8 + 1;
  } while ((CColorVertex *)local_3c8 != &local_58);
  local_3a0 = vVar1.field_0;
  x = local_98 + local_3a0.x;
  aStack_39c = vVar1.field_1;
  fVar6 = local_94 + aStack_39c.y;
  UI(in_RDI);
  fVar7 = CUI::PixelSize((CUI *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  fVar7 = fVar7 * -5.0 + fVar6;
  UI(in_RDI);
  w = CUI::PixelSize((CUI *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  UI(in_RDI);
  fVar8 = CUI::PixelSize((CUI *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  IGraphics::CQuadItem::CQuadItem(&local_284,x,fVar7,w,fVar8 * 11.0);
  local_78.m_X = local_284.m_X;
  local_78.m_Y = local_284.m_Y;
  local_78.m_Width = local_284.m_Width;
  local_78.m_Height = local_284.m_Height;
  fVar8 = local_98 + local_3a0.x;
  UI(in_RDI);
  fVar9 = CUI::PixelSize((CUI *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  fVar9 = fVar9 * -5.0 + fVar8;
  y = local_94 + aStack_39c.y;
  UI(in_RDI);
  fVar10 = CUI::PixelSize((CUI *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  UI(in_RDI);
  h = CUI::PixelSize((CUI *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  IGraphics::CQuadItem::CQuadItem(&local_294,fVar9,y,fVar10 * 11.0,h);
  local_68.m_X = local_294.m_X;
  local_68.m_Y = local_294.m_Y;
  local_68.m_Width = local_294.m_Width;
  local_68.m_Height = local_294.m_Height;
  pIVar5 = Graphics(in_RDI);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x1d])(pIVar5,&local_78,2);
  pIVar5 = Graphics(in_RDI);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x18])();
  UI(in_RDI);
  bVar4 = CUI::DoPickerLogic((CUI *)CONCAT44(fVar7,fVar6),
                             (void *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                             (CUIRect *)
                             CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                             (float *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                             &in_stack_fffffffffffffba8->x);
  if (bVar4) {
    local_c4 = CONCAT44(local_298 / local_90,(float)local_c4);
    local_bc.z = 1.0 - local_29c / local_8c;
  }
  pIVar5 = Graphics(in_RDI);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x17])();
  vector4_base<float>::vector4_base((vector4_base<float> *)&local_2ac);
  vector4_base<float>::vector4_base((vector4_base<float> *)&local_2bc);
  fVar9 = local_9c / 6.0;
  for (local_3a8 = 0; local_3a8 < 6; local_3a8 = local_3a8 + 1) {
    vector4_base<float>::vector4_base
              (&local_2cc,PopupColorPicker::s_aColorIndices[local_3a8][0],
               PopupColorPicker::s_aColorIndices[local_3a8][1],
               PopupColorPicker::s_aColorIndices[local_3a8][2],1.0);
    local_2ac = local_2cc.field_0;
    aStack_2a8 = local_2cc.field_1;
    local_2a4 = local_2cc.field_2;
    aStack_2a0 = local_2cc.field_3;
    vector4_base<float>::vector4_base
              (&local_2dc,PopupColorPicker::s_aColorIndices[local_3a8 + 1][0],
               PopupColorPicker::s_aColorIndices[local_3a8 + 1][1],
               PopupColorPicker::s_aColorIndices[local_3a8 + 1][2],1.0);
    local_2bc = local_2dc.field_0;
    aStack_2b8 = local_2dc.field_1;
    local_2b4 = local_2dc.field_2;
    aStack_2b0 = local_2dc.field_3;
    IGraphics::CColorVertex::CColorVertex
              (&local_2f0,0,local_2ac.x,aStack_2a8.y,local_2a4.z,aStack_2a0.w);
    local_58.m_Index = local_2f0.m_Index;
    local_58.m_R = local_2f0.m_R;
    local_58.m_G = local_2f0.m_G;
    local_58.m_B = local_2f0.m_B;
    local_58.m_A = local_2f0.m_A;
    IGraphics::CColorVertex::CColorVertex
              (&local_304,1,local_2ac.x,aStack_2a8.y,local_2a4.z,aStack_2a0.w);
    local_44.m_Index = local_304.m_Index;
    local_44.m_R = local_304.m_R;
    local_44.m_G = local_304.m_G;
    local_44.m_B = local_304.m_B;
    local_44.m_A = local_304.m_A;
    IGraphics::CColorVertex::CColorVertex
              (&local_318,2,local_2bc.x,aStack_2b8.y,local_2b4.z,aStack_2b0.w);
    local_30.m_Index = local_318.m_Index;
    local_30.m_R = local_318.m_R;
    local_30.m_G = local_318.m_G;
    local_30.m_B = local_318.m_B;
    local_30.m_A = local_318.m_A;
    IGraphics::CColorVertex::CColorVertex
              (&local_32c,3,local_2bc.x,aStack_2b8.y,local_2b4.z,aStack_2b0.w);
    local_1c.m_Index = local_32c.m_Index;
    local_1c.m_R = local_32c.m_R;
    local_1c.m_G = local_32c.m_G;
    local_1c.m_B = local_32c.m_B;
    local_1c.m_A = local_32c.m_A;
    pIVar5 = Graphics(in_RDI);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x20])(pIVar5,&local_58,4);
    IGraphics::CQuadItem::CQuadItem
              (&local_33c,local_a8,fVar9 * (float)local_3a8 + local_a4,local_a0,fVar9);
    pIVar5 = Graphics(in_RDI);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x1d])(pIVar5,&local_33c,1);
  }
  pIVar5 = Graphics(in_RDI);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x21])(0x3f000000,0x3f000000,0x3f000000,0x3f800000);
  fVar9 = (1.0 - (float)local_c4) * local_9c + local_a4;
  UI(in_RDI);
  fVar10 = CUI::PixelSize((CUI *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  IGraphics::CQuadItem::CQuadItem(&local_34c,local_a8,fVar9,local_a0,fVar10);
  pIVar5 = Graphics(in_RDI);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x1d])(pIVar5,&local_34c,1);
  pIVar5 = Graphics(in_RDI);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x18])();
  UI(in_RDI);
  bVar4 = CUI::DoPickerLogic((CUI *)CONCAT44(fVar7,fVar6),(void *)CONCAT44(local_a8,local_a0),
                             (CUIRect *)CONCAT44(fVar9,in_stack_fffffffffffffbb8),
                             (float *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                             &in_stack_fffffffffffffba8->x);
  if (bVar4) {
    local_c4 = CONCAT44(local_c4._4_4_,1.0 - local_29c / local_9c);
  }
  CUIRect::Draw(this,Color,a,i_01);
  iVar12 = DoButton_Editor_Common
                     ((CEditor *)CONCAT44(y,fVar8),(void *)CONCAT44(x,w),
                      (char *)CONCAT44(fVar7,fVar6),(int)local_a8,
                      (CUIRect *)CONCAT44(fVar9,in_stack_fffffffffffffbb8),
                      (int)in_stack_fffffffffffffbb4,(char *)CONCAT44(i,iVar12));
  if ((iVar12 != 0) && (0.0 < (in_RDI->m_SelectedColor).field_3.w)) {
    vector3_base<float>::vector3_base
              (&local_364,(in_RDI->m_SelectedColor).field_0.x,(in_RDI->m_SelectedColor).field_1.y,
               (in_RDI->m_SelectedColor).field_2.z);
    rgb.field_1.y = ny;
    rgb.field_0 = (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)i_00;
    rgb.field_2 = aVar13;
    vVar11 = RgbToHsv(rgb);
    local_350 = vVar11.field_2;
    local_358 = vVar11._0_8_;
    local_c4 = local_358;
    local_bc = local_350;
  }
  (in_RDI->m_SelectedPickerColor).field_2 = local_bc;
  (in_RDI->m_SelectedPickerColor).field_0 =
       (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)(float)local_c4;
  (in_RDI->m_SelectedPickerColor).field_1 =
       (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)local_c4._4_4_;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return false;
}

Assistant:

bool CEditor::PopupColorPicker(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CUIRect SVPicker, HuePicker, Palette;
	View.HSplitBottom(20.0f, &SVPicker, &Palette);
	SVPicker.VSplitRight(20.0f, &SVPicker, &HuePicker);
	HuePicker.VSplitLeft(4.0f, 0x0, &HuePicker);
	Palette.HSplitTop(4.0f, 0x0, &Palette);

	pEditor->Graphics()->TextureClear();
	pEditor->Graphics()->QuadsBegin();

	// base: white - hue
	vec3 hsv = pEditor->m_SelectedPickerColor;
	IGraphics::CColorVertex ColorArray[4];

	vec3 c = HsvToRgb(vec3(hsv.x, 0.0f, 1.0f));
	ColorArray[0] = IGraphics::CColorVertex(0, c.r, c.g, c.b, 1.0f);
	c = HsvToRgb(vec3(hsv.x, 1.0f, 1.0f));
	ColorArray[1] = IGraphics::CColorVertex(1, c.r, c.g, c.b, 1.0f);
	c = HsvToRgb(vec3(hsv.x, 1.0f, 1.0f));
	ColorArray[2] = IGraphics::CColorVertex(2, c.r, c.g, c.b, 1.0f);
	c = HsvToRgb(vec3(hsv.x, 0.0f, 1.0f));
	ColorArray[3] = IGraphics::CColorVertex(3, c.r, c.g, c.b, 1.0f);

	pEditor->Graphics()->SetColorVertex(ColorArray, 4);

	IGraphics::CQuadItem QuadItem(SVPicker.x, SVPicker.y, SVPicker.w, SVPicker.h);
	pEditor->Graphics()->QuadsDrawTL(&QuadItem, 1);

	// base: transparent - black
	ColorArray[0] = IGraphics::CColorVertex(0, 0.0f, 0.0f, 0.0f, 0.0f);
	ColorArray[1] = IGraphics::CColorVertex(1, 0.0f, 0.0f, 0.0f, 0.0f);
	ColorArray[2] = IGraphics::CColorVertex(2, 0.0f, 0.0f, 0.0f, 1.0f);
	ColorArray[3] = IGraphics::CColorVertex(3, 0.0f, 0.0f, 0.0f, 1.0f);

	pEditor->Graphics()->SetColorVertex(ColorArray, 4);

	pEditor->Graphics()->QuadsDrawTL(&QuadItem, 1);

	pEditor->Graphics()->QuadsEnd();

	// marker
	vec2 Marker = vec2(hsv.y, (1.0f - hsv.z)) * vec2(SVPicker.w, SVPicker.h);
	pEditor->Graphics()->QuadsBegin();
	pEditor->Graphics()->SetColor(0.5f, 0.5f, 0.5f, 1.0f);
	IGraphics::CQuadItem aMarker[2];
	aMarker[0] = IGraphics::CQuadItem(SVPicker.x+Marker.x, SVPicker.y+Marker.y - 5.0f*pEditor->UI()->PixelSize(), pEditor->UI()->PixelSize(), 11.0f*pEditor->UI()->PixelSize());
	aMarker[1] = IGraphics::CQuadItem(SVPicker.x+Marker.x - 5.0f*pEditor->UI()->PixelSize(), SVPicker.y+Marker.y, 11.0f*pEditor->UI()->PixelSize(), pEditor->UI()->PixelSize());
	pEditor->Graphics()->QuadsDrawTL(aMarker, 2);
	pEditor->Graphics()->QuadsEnd();

	// logic
	float X, Y;
	static int s_SVPicker = 0;
	if(pEditor->UI()->DoPickerLogic(&s_SVPicker, &SVPicker, &X, &Y))
	{
		hsv.y = X/SVPicker.w;
		hsv.z = 1.0f - Y/SVPicker.h;
	}

	// hue slider
	static const float s_aColorIndices[7][3] = {
		{1.0f, 0.0f, 0.0f}, // red
		{1.0f, 0.0f, 1.0f},	// magenta
		{0.0f, 0.0f, 1.0f}, // blue
		{0.0f, 1.0f, 1.0f}, // cyan
		{0.0f, 1.0f, 0.0f}, // green
		{1.0f, 1.0f, 0.0f}, // yellow
		{1.0f, 0.0f, 0.0f}  // red
	};

	pEditor->Graphics()->QuadsBegin();
	vec4 ColorTop, ColorBottom;
	float Offset = HuePicker.h/6.0f;
	for(int j = 0; j < 6; j++)
	{
		ColorTop = vec4(s_aColorIndices[j][0], s_aColorIndices[j][1], s_aColorIndices[j][2], 1.0f);
		ColorBottom = vec4(s_aColorIndices[j+1][0], s_aColorIndices[j+1][1], s_aColorIndices[j+1][2], 1.0f);

		ColorArray[0] = IGraphics::CColorVertex(0, ColorTop.r, ColorTop.g, ColorTop.b, ColorTop.a);
		ColorArray[1] = IGraphics::CColorVertex(1, ColorTop.r, ColorTop.g, ColorTop.b, ColorTop.a);
		ColorArray[2] = IGraphics::CColorVertex(2, ColorBottom.r, ColorBottom.g, ColorBottom.b, ColorBottom.a);
		ColorArray[3] = IGraphics::CColorVertex(3, ColorBottom.r, ColorBottom.g, ColorBottom.b, ColorBottom.a);
		pEditor->Graphics()->SetColorVertex(ColorArray, 4);
		IGraphics::CQuadItem QuadItem(HuePicker.x, HuePicker.y+Offset*j, HuePicker.w, Offset);
		pEditor->Graphics()->QuadsDrawTL(&QuadItem, 1);
	}

	// marker
	pEditor->Graphics()->SetColor(0.5f, 0.5f, 0.5f, 1.0f);
	IGraphics::CQuadItem QuadItemMarker(HuePicker.x, HuePicker.y + (1.0f - hsv.x) * HuePicker.h, HuePicker.w, pEditor->UI()->PixelSize());
	pEditor->Graphics()->QuadsDrawTL(&QuadItemMarker, 1);

	pEditor->Graphics()->QuadsEnd();

	static int s_HuePicker = 0;
	if(pEditor->UI()->DoPickerLogic(&s_HuePicker, &HuePicker, &X, &Y))
	{
		hsv.x = 1.0f - Y/HuePicker.h;
	}

	// palette
	static int s_Palette = 0;
	Palette.Draw(pEditor->m_SelectedColor, 0.0f, CUIRect::CORNER_NONE);
	if(pEditor->DoButton_Editor_Common(&s_Palette, 0x0, 0, &Palette, 0, 0x0))
	{
		if(pEditor->m_SelectedColor.a > 0.0f)
			hsv = RgbToHsv(vec3(pEditor->m_SelectedColor.r, pEditor->m_SelectedColor.g, pEditor->m_SelectedColor.b));
	}

	pEditor->m_SelectedPickerColor = hsv;

	return false;
}